

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.h
# Opt level: O1

void bandit::describe(char *desc,voidfunc_t *func)

{
  listener *listener;
  int iVar1;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<void_()>::function((function<void_()> *)&local_30,func);
  listener = detail::registered_listener(bandit::detail::listener*)::reporter_;
  if (detail::context_stack()::contexts == '\0') {
    iVar1 = __cxa_guard_acquire(&detail::context_stack()::contexts);
    if (iVar1 != 0) {
      detail::context_stack()::contexts._64_8_ = 0;
      detail::context_stack()::contexts._72_8_ = 0;
      detail::context_stack()::contexts._48_8_ = 0;
      detail::context_stack()::contexts._56_8_ = 0;
      detail::context_stack()::contexts._32_8_ = 0;
      detail::context_stack()::contexts._40_8_ = 0;
      detail::context_stack()::contexts._16_8_ = 0;
      detail::context_stack()::contexts._24_8_ = 0;
      detail::context_stack()::contexts._0_8_ = 0;
      detail::context_stack()::contexts._8_8_ = 0;
      std::_Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>::
      _M_initialize_map((_Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
                         *)detail::context_stack()::contexts,0);
      __cxa_atexit(std::deque<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
                   ::~deque,detail::context_stack()::contexts,&__dso_handle);
      __cxa_guard_release(&detail::context_stack()::contexts);
    }
  }
  describe(desc,(voidfunc_t *)&local_30,listener,(contextstack_t *)detail::context_stack()::contexts
           ,false);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

inline void describe(const char* desc, detail::voidfunc_t func)
  {
    describe(desc, func, detail::registered_listener(), detail::context_stack());
  }